

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O1

void create_mplayers(int num,boolean special)

{
  boolean bVar1;
  uint uVar2;
  uint uVar3;
  permonst *ptr;
  int x;
  int y;
  monst fakemon;
  monst local_a8;
  
  do {
    if (num == 0) {
      return;
    }
    uVar2 = mt_random();
    ptr = (permonst *)
          ((long)&((permonst *)(mons[0x159].mattk + -4))->mname + (ulong)((uVar2 & 0xf) << 6));
    uVar2 = 0;
    local_a8.data = ptr;
    do {
      uVar3 = mt_random();
      x = uVar3 % 0x4c + 2;
      uVar3 = mt_random();
      y = uVar3 % 0x13 + 1;
      bVar1 = goodpos(level,x,y,&local_a8,0);
      if (bVar1 != '\0') goto LAB_001f2732;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x34);
    uVar2 = 0x34;
LAB_001f2732:
    if (0x32 < uVar2) {
      return;
    }
    mk_mplayer(ptr,level,(xchar)x,(xchar)y,special);
    num = num + -1;
  } while( true );
}

Assistant:

void create_mplayers(int num, boolean special)
{
	int pm, x, y;
	struct monst fakemon;

	while (num) {
		int tryct = 0;

		/* roll for character class */
		pm = PM_ARCHEOLOGIST + rn2(PM_WIZARD - PM_ARCHEOLOGIST + 1);
		fakemon.data = &mons[pm];

		/* roll for an available location */
		do {
		    x = rn1(COLNO-4, 2);
		    y = rnd(ROWNO-2);
		} while (!goodpos(level, x, y, &fakemon, 0) && tryct++ <= 50);

		/* if pos not found in 50 tries, don't bother to continue */
		if (tryct > 50) return;

		mk_mplayer(&mons[pm], level, (xchar)x, (xchar)y, special);
		num--;
	}
}